

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmLocalGenerator *lg,
                   cmGeneratorExpressionContext *context,cmGeneratorTarget *headTarget,
                   cmGeneratorTarget *currentTarget,cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  pointer pcVar2;
  string *psVar3;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_58;
  undefined1 local_48 [8];
  cmGeneratorExpression ge;
  cmGeneratorTarget *currentTarget_local;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorExpressionContext *context_local;
  cmLocalGenerator *lg_local;
  string *prop_local;
  string *result;
  
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currentTarget;
  cmListFileBacktrace::cmListFileBacktrace(&local_58,&context->Backtrace);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_48,&local_58);
  cmListFileBacktrace::~cmListFileBacktrace(&local_58);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff90,(string *)local_48)
  ;
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem
            (pcVar2,(bool)(context->EvaluateForBuildsystem & 1));
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  psVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,lg,&context->Config,(bool)(context->Quiet & 1),headTarget,
                      (cmGeneratorTarget *)
                      ge.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,dagChecker,&context->Language);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadContextSensitiveCondition = true;
  }
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadHeadSensitiveCondition = true;
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&stack0xffffffffffffff90);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
  std::string const& prop, cmLocalGenerator* lg,
  cmGeneratorExpressionContext* context, cmGeneratorTarget const* headTarget,
  cmGeneratorTarget const* currentTarget,
  cmGeneratorExpressionDAGChecker* dagChecker)
{
  cmGeneratorExpression ge(context->Backtrace);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  std::string result =
    cge->Evaluate(lg, context->Config, context->Quiet, headTarget,
                  currentTarget, dagChecker, context->Language);
  if (cge->GetHadContextSensitiveCondition()) {
    context->HadContextSensitiveCondition = true;
  }
  if (cge->GetHadHeadSensitiveCondition()) {
    context->HadHeadSensitiveCondition = true;
  }
  return result;
}